

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_allocator_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::NoPropagateOnCopy_CopyConstructor_Test::
~NoPropagateOnCopy_CopyConstructor_Test(NoPropagateOnCopy_CopyConstructor_Test *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_NoPropagateOnCopy).super_Test._vptr_Test = (_func_int **)&PTR__PropagateTest_00171ea0
  ;
  p_Var1 = (this->super_NoPropagateOnCopy).a2.state_.
           super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
  ::~raw_hash_set(&(this->super_NoPropagateOnCopy).t1);
  p_Var1 = (this->super_NoPropagateOnCopy).a1.state_.
           super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(NoPropagateOnCopy, CopyConstructor) {
  auto it = t1.insert(0).first;
  Table u(t1);
  EXPECT_EQ(1, a1.num_allocs());
  EXPECT_EQ(1, u.get_allocator().num_allocs());
  EXPECT_EQ(0, it->num_moves());
  EXPECT_EQ(1, it->num_copies());
}